

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void * decodeHex(char *src,int *size)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  char cVar6;
  int i;
  ulong uVar7;
  long lVar8;
  
  sVar4 = strlen(src);
  uVar7 = (long)((ulong)(uint)((int)sVar4 >> 0x1f) << 0x20 | sVar4 & 0xffffffff) / 2;
  iVar2 = (int)uVar7;
  *size = iVar2;
  pvVar5 = malloc((long)iVar2);
  lVar8 = 0;
  for (uVar7 = uVar7 & 0xffffffff; 0 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
    iVar3 = tolower((int)src[lVar8 * 2]);
    iVar2 = iVar3 + -0x57;
    if ((char)iVar3 < 'a') {
      iVar2 = iVar3 + -0x30;
    }
    iVar3 = tolower((int)src[lVar8 * 2 + 1]);
    cVar1 = (char)iVar3;
    cVar6 = cVar1 + -0x57;
    if (cVar1 < 'a') {
      cVar6 = cVar1 + -0x30;
    }
    *(char *)((long)pvVar5 + lVar8) = cVar6 + (char)(iVar2 << 4);
    lVar8 = lVar8 + 1;
  }
  return pvVar5;
}

Assistant:

static void *decodeHex( const char *src, int &size ) {
  size = (int) strlen( src )/2;
  unsigned char *data = (unsigned char*)malloc( size ), *d = data;
  const char *s = src;
  for ( int i=size; i>0; i-- ) {
    int v;
    char x = tolower(*s++);
    if ( x >= 'a' ) v = x-'a'+10; else v = x-'0';
    v = v<<4;
    x = tolower(*s++);
    if ( x >= 'a' ) v += x-'a'+10; else v += x-'0';
    *d++ = (uchar)v;
  }
  return (void*)data;
}